

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_h_predictor_4x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  byte bVar16;
  byte bVar17;
  ushort uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  bVar17 = top_row[3];
  uVar1 = *(undefined4 *)left_column;
  bVar16 = (byte)((uint)uVar1 >> 0x18);
  uVar4 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar14 = (ushort)uVar1 & 0xff;
  auVar2[0xc] = bVar16;
  auVar2._0_12_ = ZEXT812(0);
  uVar18 = (ushort)(byte)((uint)uVar1 >> 0x10);
  iVar5 = bVar17 + 0x800080;
  iVar6 = (ushort)((ushort)bVar17 * 0x6b) + 0x800080;
  iVar7 = (ushort)((ushort)bVar17 * 0xab) + 0x800080;
  iVar8 = (ushort)((ushort)bVar17 * 0xc0) + 0x800080;
  auVar19._0_4_ = (uint)(ushort)(uVar14 * 0xff) + iVar5;
  auVar19._4_4_ = (uint)(ushort)(uVar14 * 0x95) + iVar6;
  auVar19._8_4_ = (uint)(ushort)(uVar14 * 0x55) + iVar7;
  auVar19._12_4_ = (uint)(ushort)(uVar14 * 0x40) + iVar8;
  auVar9 = ZEXT416(0xd090501);
  auVar20 = pshufb(auVar19,auVar9);
  *(int *)dst = auVar20._0_4_;
  auVar21._0_4_ = (uint)(ushort)(uVar4 * 0xff) + iVar5;
  auVar21._4_4_ = (uint)(ushort)(uVar4 * 0x95) + iVar6;
  auVar21._8_4_ = (uint)(ushort)(uVar4 * 0x55) + iVar7;
  auVar21._12_4_ = (uint)(ushort)(uVar4 * 0x40) + iVar8;
  auVar20 = pshufb(auVar21,auVar9);
  *(int *)(dst + stride) = auVar20._0_4_;
  auVar22._0_4_ = (uint)(ushort)(uVar18 * 0xff) + iVar5;
  auVar22._4_4_ = (uint)(ushort)(uVar18 * 0x95) + iVar6;
  auVar22._8_4_ = (uint)(ushort)(uVar18 * 0x55) + iVar7;
  auVar22._12_4_ = (uint)(ushort)(uVar18 * 0x40) + iVar8;
  auVar20 = pshufb(auVar22,auVar9);
  *(int *)(dst + stride * 2) = auVar20._0_4_;
  sVar10 = (short)(auVar2._10_3_ >> 0x10);
  auVar15._0_4_ = (uint)(ushort)(sVar10 * 0xff) + iVar5;
  auVar15._4_4_ = (uint)(ushort)((ushort)bVar16 * 0x95) + iVar6;
  auVar15._8_4_ = (uint)(ushort)(sVar10 * 0x55) + iVar7;
  auVar15._12_4_ = (uint)(ushort)(sVar10 * 0x40) + iVar8;
  auVar20 = pshufb(auVar15,auVar9);
  *(int *)(dst + stride * 3) = auVar20._0_4_;
  uVar1 = *(undefined4 *)(left_column + 4);
  bVar17 = (byte)((uint)uVar1 >> 0x18);
  uVar4 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar14 = (ushort)uVar1 & 0xff;
  auVar3[0xc] = bVar17;
  auVar3._0_12_ = ZEXT812(0);
  uVar18 = (ushort)(byte)((uint)uVar1 >> 0x10);
  auVar20._0_4_ = (uint)(ushort)(uVar14 * 0xff) + iVar5;
  auVar20._4_4_ = (uint)(ushort)(uVar14 * 0x95) + iVar6;
  auVar20._8_4_ = (uint)(ushort)(uVar14 * 0x55) + iVar7;
  auVar20._12_4_ = (uint)(ushort)(uVar14 * 0x40) + iVar8;
  auVar20 = pshufb(auVar20,auVar9);
  *(int *)(dst + stride * 4) = auVar20._0_4_;
  auVar11._0_4_ = (uint)(ushort)(uVar4 * 0xff) + iVar5;
  auVar11._4_4_ = (uint)(ushort)(uVar4 * 0x95) + iVar6;
  auVar11._8_4_ = (uint)(ushort)(uVar4 * 0x55) + iVar7;
  auVar11._12_4_ = (uint)(ushort)(uVar4 * 0x40) + iVar8;
  auVar20 = pshufb(auVar11,auVar9);
  *(int *)(dst + stride * 5) = auVar20._0_4_;
  auVar12._0_4_ = (uint)(ushort)(uVar18 * 0xff) + iVar5;
  auVar12._4_4_ = (uint)(ushort)(uVar18 * 0x95) + iVar6;
  auVar12._8_4_ = (uint)(ushort)(uVar18 * 0x55) + iVar7;
  auVar12._12_4_ = (uint)(ushort)(uVar18 * 0x40) + iVar8;
  auVar20 = pshufb(auVar12,auVar9);
  *(int *)(dst + stride * 6) = auVar20._0_4_;
  sVar10 = (short)(auVar3._10_3_ >> 0x10);
  auVar13._0_4_ = (uint)(ushort)(sVar10 * 0xff) + iVar5;
  auVar13._4_4_ = (uint)(ushort)((ushort)bVar17 * 0x95) + iVar6;
  auVar13._8_4_ = (uint)(ushort)(sVar10 * 0x55) + iVar7;
  auVar13._12_4_ = (uint)(ushort)(sVar10 * 0x40) + iVar8;
  auVar9 = pshufb(auVar13,auVar9);
  *(int *)(dst + stride * 7) = auVar9._0_4_;
  return;
}

Assistant:

void aom_smooth_h_predictor_4x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi32(Load4(left_column));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 4));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}